

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O2

ktx_error_code_e anon_unknown.dwarf_5278::StreambufStream::getpos(ktxStream *str,ktx_off_t *offset)

{
  long *plVar1;
  ktx_off_t kVar2;
  ostream *poVar3;
  
  plVar1 = *(long **)((str->data).file + 8);
  kVar2 = (**(code **)(*plVar1 + 0x20))(plVar1,0,1,*(undefined4 *)((str->data).file + 0x10));
  *offset = kVar2;
  poVar3 = std::operator<<((ostream *)&std::cerr,"\tgetpos: ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  return KTX_SUCCESS;
}

Assistant:

static KTX_error_code getpos(ktxStream* str, ktx_off_t *offset)
    {
        auto self = parent(str);
        *offset = ktx_off_t(self->_streambuf->pubseekoff(0, std::ios::cur, self->_seek_mode));
        std::cerr << "\tgetpos: " << *offset << std::endl;
        return KTX_SUCCESS;
    }